

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool __thiscall cmCTestTestHandler::GetListOfTests(cmCTestTestHandler *this)

{
  cmCTest *pcVar1;
  _Head_base<0UL,_cmState_*,_false> _Var2;
  bool bVar3;
  string *psVar4;
  size_t sVar5;
  cmValue cVar6;
  bool bVar7;
  char *pcVar8;
  string_view value;
  ostringstream cmCTestLog_msg_1;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  _Any_data local_1988;
  code *local_1978;
  code *pcStack_1970;
  _Any_data local_1968;
  code *local_1958;
  code *pcStack_1950;
  _Any_data local_1948;
  code *local_1938;
  code *pcStack_1930;
  long *local_1928;
  long local_1918 [2];
  undefined1 local_1908 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18f8 [6];
  ios_base local_1898 [272];
  undefined1 local_1788 [2040];
  undefined1 local_f90 [1904];
  _Head_base<0UL,_cmState_*,_false> local_820;
  cmState *local_818;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcStack_810;
  PositionType local_808;
  cmGlobalGenerator local_718;
  
  if ((this->IncludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->IncludeTestsRegularExpression,(this->IncludeRegExp)._M_dataplus._M_p);
  }
  if ((this->ExcludeRegExp)._M_string_length != 0) {
    cmsys::RegularExpression::compile
              (&this->ExcludeTestsRegularExpression,(this->ExcludeRegExp)._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f90);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_f90,"Constructing a list of tests",0x1c);
  std::ios::widen((char)(ostringstream *)local_f90 +
                  (char)(((pointer)(local_f90._0_8_ + -0x18))->_M_t).
                        super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                        .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl);
  std::ostream::put((char)local_f90);
  std::ostream::flush();
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar1,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x6f7,(char *)local_1788._0_8_,(this->super_cmCTestGenericHandler).Quiet);
  pcVar8 = local_1788 + 0x10;
  if ((char *)local_1788._0_8_ != pcVar8) {
    operator_delete((void *)local_1788._0_8_,local_1788._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f90);
  std::ios_base::~ios_base((ios_base *)(local_f90 + 0x70));
  cmake::cmake((cmake *)local_f90,RoleScript,CTest,Normal);
  local_1788._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1788,"");
  cmake::SetHomeDirectory((cmake *)local_f90,(string *)local_1788);
  if ((char *)local_1788._0_8_ != pcVar8) {
    operator_delete((void *)local_1788._0_8_,local_1788._16_8_ + 1);
  }
  local_1788._0_8_ = pcVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1788,"");
  cmake::SetHomeOutputDirectory((cmake *)local_f90,(string *)local_1788);
  if ((char *)local_1788._0_8_ != pcVar8) {
    operator_delete((void *)local_1788._0_8_,local_1788._16_8_ + 1);
  }
  local_1788._16_8_ = local_808;
  local_1788._0_8_ = local_818;
  local_1788._8_8_ = pcStack_810;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_1788);
  cmGlobalGenerator::cmGlobalGenerator(&local_718,(cmake *)local_f90);
  local_18f8[0]._M_allocated_capacity = local_808;
  local_1908._0_8_ = local_818;
  local_1908._8_8_ = pcStack_810;
  cmMakefile::cmMakefile((cmMakefile *)local_1788,&local_718,(cmStateSnapshot *)local_1908);
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1908,"CTEST_CONFIGURATION_TYPE","");
  psVar4 = cmCTest::GetConfigType_abi_cxx11_((this->super_cmCTestGenericHandler).CTest);
  value._M_str = (psVar4->_M_dataplus)._M_p;
  value._M_len = psVar4->_M_string_length;
  cmMakefile::AddDefinition((cmMakefile *)local_1788,(string *)local_1908,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl = local_820._M_head_impl;
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,"add_test","");
  local_1938 = (code *)0x0;
  pcStack_1930 = (code *)0x0;
  local_1948._M_unused._M_object = (void *)0x0;
  local_1948._8_8_ = 0;
  local_1948._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1948._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1948._M_unused._0_8_ = &PTR__cmCTestCommand_009aa7a0;
  pcStack_1930 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestAddTestCommand>
                 ::_M_invoke;
  local_1938 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestAddTestCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand(_Var2._M_head_impl,(string *)local_1908,(Command *)&local_1948);
  if (local_1938 != (code *)0x0) {
    (*local_1938)(&local_1948,&local_1948,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl = local_820._M_head_impl;
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,"subdirs","");
  cmState::AddBuiltinCommand
            (_Var2._M_head_impl,(string *)local_1908,
             anon_unknown.dwarf_21c1663::cmCTestSubdirCommand);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl = local_820._M_head_impl;
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,"add_subdirectory","");
  cmState::AddBuiltinCommand
            (_Var2._M_head_impl,(string *)local_1908,
             anon_unknown.dwarf_21c1663::cmCTestAddSubdirectoryCommand);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl = local_820._M_head_impl;
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,"set_tests_properties","");
  local_1958 = (code *)0x0;
  pcStack_1950 = (code *)0x0;
  local_1968._M_unused._M_object = (void *)0x0;
  local_1968._8_8_ = 0;
  local_1968._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1968._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1968._M_unused._0_8_ = &PTR__cmCTestCommand_009aa7f0;
  pcStack_1950 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetTestsPropertiesCommand>
                 ::_M_invoke;
  local_1958 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetTestsPropertiesCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand(_Var2._M_head_impl,(string *)local_1908,(Command *)&local_1968);
  if (local_1958 != (code *)0x0) {
    (*local_1958)(&local_1968,&local_1968,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  _Var2._M_head_impl = local_820._M_head_impl;
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1908,"set_directory_properties","");
  cmState::RemoveBuiltinCommand(_Var2._M_head_impl,(string *)local_1908);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  local_1908._0_8_ = local_18f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1908,"set_directory_properties","");
  local_1978 = (code *)0x0;
  pcStack_1970 = (code *)0x0;
  local_1988._M_unused._M_object = (void *)0x0;
  local_1988._8_8_ = 0;
  local_1988._M_unused._M_object = operator_new(0x10);
  *(cmCTestTestHandler **)((long)local_1988._M_unused._0_8_ + 8) = this;
  *(undefined ***)local_1988._M_unused._0_8_ = &PTR__cmCTestCommand_009aa830;
  pcStack_1970 = std::
                 _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand>
                 ::_M_invoke;
  local_1978 = std::
               _Function_handler<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&),_(anonymous_namespace)::cmCTestSetDirectoryPropertiesCommand>
               ::_M_manager;
  cmState::AddBuiltinCommand(local_820._M_head_impl,(string *)local_1908,(Command *)&local_1988);
  if (local_1978 != (code *)0x0) {
    (*local_1978)(&local_1988,&local_1988,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  pcVar8 = "CTestTestfile.cmake";
  bVar3 = cmsys::SystemTools::FileExists("CTestTestfile.cmake");
  if (!bVar3) {
    pcVar8 = "DartTestfile.txt";
    bVar3 = cmsys::SystemTools::FileExists("DartTestfile.txt");
    bVar7 = true;
    if (!bVar3) goto LAB_00516c75;
  }
  local_1908._0_8_ = local_18f8;
  sVar5 = strlen(pcVar8);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1908,pcVar8,pcVar8 + sVar5);
  bVar3 = cmMakefile::ReadListFile((cmMakefile *)local_1788,(string *)local_1908);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1908._0_8_ != local_18f8) {
    operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
  }
  if (((bVar3) && (cmSystemTools::s_ErrorOccurred == false)) &&
     (cmSystemTools::s_FatalErrorOccurred == false)) {
    bVar3 = cmSystemTools::GetInterruptFlag();
    if (!bVar3) {
      local_1908._0_8_ = local_18f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1908,"CTEST_RESOURCE_SPEC_FILE","");
      cVar6 = cmMakefile::GetDefinition((cmMakefile *)local_1788,(string *)local_1908);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1908._0_8_ != local_18f8) {
        operator_delete((void *)local_1908._0_8_,local_18f8[0]._M_allocated_capacity + 1);
      }
      if (cVar6.Value != (string *)0x0 && (this->ResourceSpecFile)._M_string_length == 0) {
        std::__cxx11::string::_M_assign((string *)&this->ResourceSpecFile);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1908);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1908,"Done constructing a list of tests",0x21);
      std::ios::widen((char)(ostream *)local_1908 + (char)*(undefined8 *)(local_1908._0_8_ + -0x18))
      ;
      std::ostream::put((char)local_1908);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x72b,(char *)local_1928,(this->super_cmCTestGenericHandler).Quiet);
      if (local_1928 != local_1918) {
        operator_delete(local_1928,local_1918[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1908);
      std::ios_base::~ios_base(local_1898);
      bVar7 = true;
      goto LAB_00516c75;
    }
  }
  bVar7 = false;
LAB_00516c75:
  cmMakefile::~cmMakefile((cmMakefile *)local_1788);
  cmGlobalGenerator::~cmGlobalGenerator(&local_718);
  cmake::~cmake((cmake *)local_f90);
  return bVar7;
}

Assistant:

bool cmCTestTestHandler::GetListOfTests()
{
  if (!this->IncludeRegExp.empty()) {
    this->IncludeTestsRegularExpression.compile(this->IncludeRegExp);
  }
  if (!this->ExcludeRegExp.empty()) {
    this->ExcludeTestsRegularExpression.compile(this->ExcludeRegExp);
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Constructing a list of tests" << std::endl, this->Quiet);
  cmake cm(cmake::RoleScript, cmState::CTest);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  mf.AddDefinition("CTEST_CONFIGURATION_TYPE", this->CTest->GetConfigType());

  // Add handler for ADD_TEST
  cm.GetState()->AddBuiltinCommand("add_test", cmCTestAddTestCommand(this));

  // Add handler for SUBDIRS
  cm.GetState()->AddBuiltinCommand("subdirs", cmCTestSubdirCommand);

  // Add handler for ADD_SUBDIRECTORY
  cm.GetState()->AddBuiltinCommand("add_subdirectory",
                                   cmCTestAddSubdirectoryCommand);

  // Add handler for SET_TESTS_PROPERTIES
  cm.GetState()->AddBuiltinCommand("set_tests_properties",
                                   cmCTestSetTestsPropertiesCommand(this));

  // Add handler for SET_DIRECTORY_PROPERTIES
  cm.GetState()->RemoveBuiltinCommand("set_directory_properties");
  cm.GetState()->AddBuiltinCommand("set_directory_properties",
                                   cmCTestSetDirectoryPropertiesCommand(this));

  const char* testFilename;
  if (cmSystemTools::FileExists("CTestTestfile.cmake")) {
    // does the CTestTestfile.cmake exist ?
    testFilename = "CTestTestfile.cmake";
  } else if (cmSystemTools::FileExists("DartTestfile.txt")) {
    // does the DartTestfile.txt exist ?
    testFilename = "DartTestfile.txt";
  } else {
    return true;
  }

  if (!mf.ReadListFile(testFilename)) {
    return false;
  }
  if (cmSystemTools::GetErrorOccurredFlag()) {
    // SEND_ERROR or FATAL_ERROR in CTestTestfile or TEST_INCLUDE_FILES
    return false;
  }
  cmValue specFile = mf.GetDefinition("CTEST_RESOURCE_SPEC_FILE");
  if (this->ResourceSpecFile.empty() && specFile) {
    this->ResourceSpecFile = *specFile;
  }
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Done constructing a list of tests" << std::endl,
                     this->Quiet);
  return true;
}